

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeSplit(ConvertLayerParameters layerParameters)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  string *layerType;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  reference __k;
  mapped_type *this_00;
  NetParameter *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  string input;
  allocator local_41;
  string local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  local_20 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)layerParameters._24_8_;
  iVar2 = caffe::LayerParameter::bottom_size((LayerParameter *)mappingDataBlobNames);
  if (iVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Must have 1 input",&local_41);
    psVar3 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    layerType = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    errorInCaffeProto(&local_40,psVar3,layerType);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  psVar3 = caffe::LayerParameter::bottom_abi_cxx11_((LayerParameter *)mappingDataBlobNames,0);
  std::__cxx11::string::string((string *)&__range1,(string *)psVar3);
  this = caffe::LayerParameter::top_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(this);
  output = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(this);
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1,(iterator *)&output);
    if (!bVar1) break;
    __k = google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](local_20,__k);
    std::__cxx11::string::operator=((string *)this_00,(string *)&__range1);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)&__range1);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeSplit(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    /*
     Split: Split layer in caffe is basically a Renaming layer:  needs special operation: add names to the hash
     */
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    if (caffeLayer.bottom_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input",caffeLayer.name(),caffeLayer.type());
    }
    
    std::string input = caffeLayer.bottom(0);
    for (const auto& output: caffeLayer.top()){
        mappingDataBlobNames[output] = input;
    }
}